

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O2

uint32_t binary_fuse_calculate_segment_length(uint32_t arity,uint32_t size)

{
  double dVar1;
  
  dVar1 = log((double)arity);
  dVar1 = floor(dVar1 / 1.2029723039923526 + 2.25);
  return 1 << ((byte)(int)dVar1 & 0x1f);
}

Assistant:

static inline uint32_t binary_fuse_calculate_segment_length(uint32_t arity,
                                                             uint32_t size) {
  // These parameters are very sensitive. Replacing 'floor' by 'round' can
  // substantially affect the construction time.
  if (arity == 3) {
    return ((uint32_t)1) << (int)(floor(log((double)(size)) / log(3.33) + 2.25));
  } else if (arity == 4) {
    return ((uint32_t)1) << (int)(floor(log((double)(size)) / log(2.91) - 0.5));
  } else {
    return 65536;
  }
}